

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mygetopt.c
# Opt level: O0

int util_getopt(int argc,char **argv,char *optstring)

{
  ushort **ppuVar1;
  char *pcVar2;
  char *temp;
  int rv;
  char *p;
  char *optstring_local;
  char **argv_local;
  int argc_local;
  
  if (((argc <= util_optind) || (argv == (char **)0x0)) || (optstring == (char *)0x0)) {
    return -1;
  }
  if (util_getopt::arg == (char *)0x0) {
    pcVar2 = argv[util_optind];
    if (pcVar2 == (char *)0x0) {
      return -1;
    }
    if (*pcVar2 != '-') {
      return -1;
    }
    if (pcVar2[1] == '\0') {
      return -1;
    }
    if ((pcVar2[1] == '-') && (pcVar2[2] == '\0')) {
      util_optind = util_optind + 1;
      return -1;
    }
    util_getopt::arg = pcVar2 + 1;
  }
  util_optopt = (int)*util_getopt::arg;
  util_getopt::arg = util_getopt::arg + 1;
  ppuVar1 = __ctype_b_loc();
  if ((((*ppuVar1)[util_optopt] & 8) == 0) ||
     (pcVar2 = strchr(optstring,util_optopt), pcVar2 == (char *)0x0)) {
    if ((util_opterr != 0) && (*optstring != ':')) {
      fprintf(_stderr,"%s: Unrecognized option: \'-%c\'\n",*argv,(ulong)(uint)util_optopt);
    }
    temp._4_4_ = 0x3f;
  }
  else {
    temp._4_4_ = util_optopt;
    if (pcVar2[1] == ':') {
      if (*util_getopt::arg == '\0') {
        util_optind = util_optind + 1;
        util_optarg = argv[util_optind];
        if (util_optarg == (char *)0x0) {
          if ((util_opterr != 0) && (*optstring != ':')) {
            fprintf(_stderr,"%s: Option -%c requires an operand\n",*argv,(ulong)(uint)util_optopt);
          }
          temp._4_4_ = 0x3f;
          if (*optstring == ':') {
            temp._4_4_ = 0x3a;
          }
        }
      }
      else {
        util_optarg = util_getopt::arg;
        util_getopt::arg = (char *)0x0;
        util_optind = util_optind + 1;
      }
    }
  }
  if ((util_getopt::arg != (char *)0x0) && (*util_getopt::arg == '\0')) {
    util_getopt::arg = (char *)0x0;
    util_optind = util_optind + 1;
  }
  return temp._4_4_;
}

Assistant:

int getopt(int argc, char *const argv[], const char *optstring) {
    static char* arg = NULL;
    char*p;
    int rv;
    if(optind >= argc || !argv || !optstring) return -1;
    if(arg == NULL) {
        char *temp = argv[optind];
        if(temp == NULL) return -1;
        if(temp[0] != '-') return -1;
        if(temp[1] == '\0') return -1;
        if(temp[1] == '-' && temp[2] == '\0') { optind++; return -1; }
        arg = temp+1;
    }
    
    optopt = *arg++;
    if(isalnum(optopt) && (p=strchr(optstring,optopt))) {
        rv = optopt;
        if(p[1] == ':') {
            if(*arg) {
                /* argument of form -ffilename */
                optarg = arg;
                arg = NULL;
                optind++;
            }
            else {
                /* argument of form -f filename */
                optarg = argv[++optind]; /* optind will be increased second time later */
                if(!optarg) {
                    if(opterr && optstring[0] != ':')
                        fprintf(stderr, "%s: Option -%c requires an operand\n", argv[0], optopt);
                    rv = optstring[0] == ':' ? ':' : '?';
                }
            }
        }
    }
    else {
        if(opterr && optstring[0] != ':')
            fprintf(stderr, "%s: Unrecognized option: '-%c'\n", argv[0], optopt);
        rv = '?';
    }

    if(arg && *arg == '\0') {
        arg = NULL;
        optind++;
    }

    return rv;
}